

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::ParseState::DoFinish(ParseState *this)

{
  Regexp *re_00;
  Regexp *re;
  ParseState *this_local;
  
  DoAlternation(this);
  re_00 = this->stacktop_;
  if ((re_00 == (Regexp *)0x0) || (re_00->down_ == (Regexp *)0x0)) {
    this->stacktop_ = (Regexp *)0x0;
    this_local = (ParseState *)FinishRegexp(this,re_00);
  }
  else {
    RegexpStatus::set_code(this->status_,kRegexpMissingParen);
    RegexpStatus::set_error_arg(this->status_,&this->whole_regexp_);
    this_local = (ParseState *)0x0;
  }
  return (Regexp *)this_local;
}

Assistant:

Regexp* Regexp::ParseState::DoFinish() {
  DoAlternation();
  Regexp* re = stacktop_;
  if (re != NULL && re->down_ != NULL) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return NULL;
  }
  stacktop_ = NULL;
  return FinishRegexp(re);
}